

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# system.cc
# Opt level: O0

void __thiscall
tchecker::system::system_t::add_location
          (system_t *this,process_id_t pid,string *name,attributes_t *attributes)

{
  bool bVar1;
  invalid_argument *this_00;
  string local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  attributes_t *local_28;
  attributes_t *attributes_local;
  string *name_local;
  system_t *psStack_10;
  process_id_t pid_local;
  system_t *this_local;
  
  local_28 = attributes;
  attributes_local = (attributes_t *)name;
  name_local._4_4_ = pid;
  psStack_10 = this;
  bVar1 = processes_t::is_process(&this->super_processes_t,pid);
  if (!bVar1) {
    this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::__cxx11::to_string(&local_88,name_local._4_4_);
    std::operator+(&local_68,"Process ",&local_88);
    std::operator+(&local_48,&local_68," is not declared");
    std::invalid_argument::invalid_argument(this_00,(string *)&local_48);
    __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  locs_t::add_location(&this->super_locs_t,name_local._4_4_,(string *)attributes_local,local_28);
  return;
}

Assistant:

void system_t::add_location(tchecker::process_id_t pid, std::string const & name,
                            tchecker::system::attributes_t const & attributes)
{
  if (!tchecker::system::processes_t::is_process(pid))
    throw std::invalid_argument("Process " + std::to_string(pid) + " is not declared");
  tchecker::system::locs_t::add_location(pid, name, attributes);
}